

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O3

void __thiscall
DeckBuilder::deckShuffler(DeckBuilder *this,list<BlackCard_*,_std::allocator<BlackCard_*>_> *black)

{
  size_t *psVar1;
  BlackCard *pBVar2;
  iterator iVar3;
  int iVar4;
  _List_node_base *p_Var5;
  long lVar6;
  long lVar7;
  BlackCard **ppBVar8;
  vector<BlackCard_*,_std::allocator<BlackCard_*>_> vect;
  BlackCard **local_38;
  iterator iStack_30;
  BlackCard **local_28;
  
  local_38 = (BlackCard **)0x0;
  iStack_30._M_current = (BlackCard **)0x0;
  local_28 = (BlackCard **)0x0;
  p_Var5 = (black->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)black) {
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<BlackCard*,std::allocator<BlackCard*>>::_M_realloc_insert<BlackCard*const&>
                  ((vector<BlackCard*,std::allocator<BlackCard*>> *)&local_38,iStack_30,
                   (BlackCard **)(p_Var5 + 1));
      }
      else {
        *iStack_30._M_current = (BlackCard *)p_Var5[1]._M_next;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      iVar3._M_current = iStack_30._M_current;
      ppBVar8 = local_38;
      p_Var5 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var5->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)black);
    if ((local_38 != iStack_30._M_current) && (local_38 + 1 != iStack_30._M_current)) {
      lVar7 = 8;
      do {
        iVar4 = rand();
        lVar6 = (long)iVar4 % ((lVar7 >> 3) + 1);
        if (lVar7 != lVar6 * 8) {
          pBVar2 = *(BlackCard **)((long)ppBVar8 + lVar7);
          *(BlackCard **)((long)ppBVar8 + lVar7) = ppBVar8[lVar6];
          ppBVar8[lVar6] = pBVar2;
        }
        lVar6 = lVar7 + 8;
        lVar7 = lVar7 + 8;
      } while ((BlackCard **)((long)ppBVar8 + lVar6) != iVar3._M_current);
    }
  }
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::clear(black);
  ppBVar8 = local_38;
  if (local_38 != iStack_30._M_current) {
    do {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)*ppBVar8;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(black->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node
                ._M_size;
      *psVar1 = *psVar1 + 1;
      ppBVar8 = ppBVar8 + 1;
    } while (ppBVar8 != iStack_30._M_current);
  }
  if (local_38 != (BlackCard **)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void DeckBuilder::deckShuffler(list<BlackCard *> *black)
{
	vector<BlackCard *> vect;
	list<BlackCard *>::iterator it;
	for (it = black->begin(); it != black->end(); it++)
		vect.push_back((*it));

	random_shuffle(vect.begin(), vect.end());

	black->clear();

	vector<BlackCard *>::iterator it2;
	for (it2 = vect.begin(); it2 != vect.end(); it2++)
		black->push_back((*it2));
}